

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lincost.cc
# Opt level: O2

void __thiscall bsplib::LinCost::reset(LinCost *this,int nprocs)

{
  pointer puVar1;
  unsigned_long local_20;
  
  this->m_nprocs = nprocs;
  puVar1 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->m_sizes,(long)(nprocs + 1));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->m_counts,(long)(nprocs + 1));
  local_20 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->m_sizes,&local_20);
  return;
}

Assistant:

void LinCost::reset(int nprocs)
{
    m_nprocs = nprocs;
    m_sizes.clear(); m_counts.clear();
    m_sizes.reserve( nprocs + 1);
    m_counts.reserve( nprocs + 1);
    m_sizes.push_back(0); // we insert 0 as an extra option
}